

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::(anonymous_namespace)::
MicroStringPrevTest_SelfSetSubstrViewConstantSize_Test::
~MicroStringPrevTest_SelfSetSubstrViewConstantSize_Test
          (MicroStringPrevTest_SelfSetSubstrViewConstantSize_Test *this)

{
  internal::anon_unknown_0::MicroStringPrevTest_SelfSetSubstrViewConstantSize_Test::
  ~MicroStringPrevTest_SelfSetSubstrViewConstantSize_Test
            ((MicroStringPrevTest_SelfSetSubstrViewConstantSize_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SelfSetSubstrViewConstantSize) {
  const std::string control(str_.Get());
  if (control.size() < 3) {
    GTEST_SKIP() << "Can't substr an empty input.";
  }

  const size_t used = arena_space_used();
  const bool will_reuse = str_.Capacity() != 0;
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();

  // Here we test the fastpath in SetMaybeConstant.
  // The input is an aliasing substr that overlaps with the destination, but
  // with constant size to trigger the fastpath.
  str_.Set(str_.Get().substr(1, 2), arena());
  EXPECT_EQ(str_.Get(), absl::string_view(control).substr(1, 2));

  if (will_reuse) {
    ExpectMemoryUsed(used, false, self_used);
  }
}